

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O3

ErrorGenerator *
cmCMakePresetsErrors::INVALID_VARIABLE_OBJECT
          (ErrorGenerator *__return_storage_ptr__,ObjectError errorType,Members *extraFields)

{
  ObjectError local_5c;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsErrors.cxx:277:5)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsErrors.cxx:277:5)>
             ::_M_manager;
  JsonErrors::INVALID_NAMED_OBJECT
            ((ObjectErrorGenerator *)&local_58,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
              *)&local_38);
  local_5c = errorType;
  if (local_48 != (code *)0x0) {
    (*local_40)(__return_storage_ptr__,&local_58,&local_5c,extraFields);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

JsonErrors::ErrorGenerator INVALID_VARIABLE_OBJECT(
  JsonErrors::ObjectError errorType, const Json::Value::Members& extraFields)
{
  return JsonErrors::INVALID_NAMED_OBJECT(
    [](const Json::Value*, cmJSONState* state) -> std::string {
      return getVariableName(state);
    })(errorType, extraFields);
}